

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O0

VideoAspectRatio arNameToCode(string *arName)

{
  bool bVar1;
  string *arName_local;
  
  bVar1 = std::operator==(arName,"9x16");
  if ((((bVar1) || (bVar1 = std::operator==(arName,"16x9"), bVar1)) ||
      (bVar1 = std::operator==(arName,"9:16"), bVar1)) ||
     (bVar1 = std::operator==(arName,"16:9"), bVar1)) {
    return AR_16_9;
  }
  bVar1 = std::operator==(arName,"3:4");
  if (((!bVar1) && (bVar1 = std::operator==(arName,"4:3"), !bVar1)) &&
     ((bVar1 = std::operator==(arName,"4x3"), !bVar1 &&
      (bVar1 = std::operator==(arName,"3x4"), !bVar1)))) {
    bVar1 = std::operator==(arName,"Square");
    if (((!bVar1) && (bVar1 = std::operator==(arName,"VGA"), !bVar1)) &&
       ((bVar1 = std::operator==(arName,"1:1"), !bVar1 &&
        ((bVar1 = std::operator==(arName,"1x1"), !bVar1 &&
         (bVar1 = std::operator==(arName,"1:1 (Square)"), !bVar1)))))) {
      bVar1 = std::operator==(arName,"WIDE");
      if ((((!bVar1) &&
           (((bVar1 = std::operator==(arName,"1x2,21"), !bVar1 &&
             (bVar1 = std::operator==(arName,"1x2.21"), !bVar1)) &&
            (bVar1 = std::operator==(arName,"1:2.21"), !bVar1)))) &&
          (((bVar1 = std::operator==(arName,"1:2,21"), !bVar1 &&
            (bVar1 = std::operator==(arName,"2.21:1"), !bVar1)) &&
           (bVar1 = std::operator==(arName,"2,21:1"), !bVar1)))) &&
         ((bVar1 = std::operator==(arName,"2.21x1"), !bVar1 &&
          (bVar1 = std::operator==(arName,"2,21x1"), !bVar1)))) {
        return AR_KEEP_DEFAULT;
      }
      return AR_221_100;
    }
    return AR_VGA;
  }
  return AR_3_4;
}

Assistant:

VideoAspectRatio arNameToCode(const string& arName)
{
    if (arName == "9x16" || arName == "16x9" || arName == "9:16" || arName == "16:9")
        return VideoAspectRatio::AR_16_9;
    if (arName == "3:4" || arName == "4:3" || arName == "4x3" || arName == "3x4")
        return VideoAspectRatio::AR_3_4;
    if (arName == "Square" || arName == "VGA" || arName == "1:1" || arName == "1x1" || arName == "1:1 (Square)")
        return VideoAspectRatio::AR_VGA;
    if (arName == "WIDE" || arName == "1x2,21" || arName == "1x2.21" || arName == "1:2.21" || arName == "1:2,21" ||
        arName == "2.21:1" || arName == "2,21:1" || arName == "2.21x1" || arName == "2,21x1")
        return VideoAspectRatio::AR_221_100;

    return VideoAspectRatio::AR_KEEP_DEFAULT;
}